

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

Maybe<unsigned_long> __thiscall
kj::anon_unknown_55::tryParseInteger<unsigned_long>(anon_unknown_55 *this,StringPtr *s)

{
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  Maybe<unsigned_long> MVar1;
  Maybe<unsigned_long_long> local_30;
  unsigned_long local_20;
  unsigned_long_long max;
  StringPtr *s_local;
  
  max = (unsigned_long_long)s;
  s_local = (StringPtr *)this;
  local_20 = MaxValue_::operator_cast_to_unsigned_long((MaxValue_ *)&maxValue);
  tryParseUnsigned((anon_unknown_55 *)&local_30,(StringPtr *)max,local_20);
  Maybe<unsigned_long>::Maybe<unsigned_long_long>((Maybe<unsigned_long> *)this,&local_30);
  Maybe<unsigned_long_long>::~Maybe(&local_30);
  MVar1.ptr.field_1.value = extraout_RDX.value;
  MVar1.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar1.ptr;
}

Assistant:

Maybe<T> tryParseInteger(const StringPtr& s) {
  if (static_cast<T>(minValue) < 0) {
    long long min = static_cast<T>(minValue);
    long long max = static_cast<T>(maxValue);
    return static_cast<Maybe<T>>(tryParseSigned(s, min, max));
  } else {
    unsigned long long max = static_cast<T>(maxValue);
    return static_cast<Maybe<T>>(tryParseUnsigned(s, max));
  }
}